

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack16.h
# Opt level: O0

void ncnn::padding_reflect_pack16_avx512(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  __m512 _p_8;
  int x_8;
  __m512 _p_7;
  int x_7;
  __m512 _p_6;
  int x_6;
  float *ptr0_1;
  int y_2;
  __m512 _p_5;
  int x_5;
  __m512 _p_4;
  int x_4;
  __m512 _p_3;
  int x_3;
  int y_1;
  __m512 _p_2;
  int x_2;
  __m512 _p_1;
  int x_1;
  __m512 _p;
  int x;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_944;
  int local_8c4;
  int local_854;
  undefined8 *local_850;
  int local_844;
  int local_7c4;
  int local_744;
  int local_6c8;
  int local_6c4;
  int local_644;
  int local_5c4;
  int local_554;
  undefined8 *local_550;
  int local_544;
  undefined8 *local_540;
  undefined8 *local_538;
  
  local_540 = (undefined8 *)*in_RSI;
  local_538 = (undefined8 *)(*in_RDI + (long)(in_EDX * *(int *)((long)in_RDI + 0x2c) * 0x10) * 4);
  for (local_544 = 0; local_544 < in_EDX; local_544 = local_544 + 1) {
    local_550 = local_538;
    for (local_554 = 0; local_554 < in_R8D; local_554 = local_554 + 1) {
      puVar8 = (undefined8 *)((long)local_538 + (long)((in_R8D - local_554) * 0x10) * 4);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
    for (local_5c4 = 0; local_5c4 < *(int *)((long)in_RDI + 0x2c); local_5c4 = local_5c4 + 1) {
      uVar1 = local_550[1];
      uVar2 = local_550[2];
      uVar3 = local_550[3];
      uVar4 = local_550[4];
      uVar5 = local_550[5];
      uVar6 = local_550[6];
      uVar7 = local_550[7];
      *local_540 = *local_550;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_550 = local_550 + 8;
      local_540 = local_540 + 8;
    }
    for (local_644 = 0; local_644 < in_R9D; local_644 = local_644 + 1) {
      puVar8 = (undefined8 *)((long)local_550 + (long)(local_644 << 4) * -4 + -0x80);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
    local_538 = (undefined8 *)((long)local_538 + (long)(*(int *)((long)in_RDI + 0x2c) << 4) * -4);
  }
  for (local_6c4 = 0; local_6c4 < (int)in_RDI[6]; local_6c4 = local_6c4 + 1) {
    for (local_6c8 = 0; local_6c8 < in_R8D; local_6c8 = local_6c8 + 1) {
      puVar8 = (undefined8 *)((long)local_538 + (long)((in_R8D - local_6c8) * 0x10) * 4);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
    for (local_744 = 0; local_744 < *(int *)((long)in_RDI + 0x2c); local_744 = local_744 + 1) {
      uVar1 = local_538[1];
      uVar2 = local_538[2];
      uVar3 = local_538[3];
      uVar4 = local_538[4];
      uVar5 = local_538[5];
      uVar6 = local_538[6];
      uVar7 = local_538[7];
      *local_540 = *local_538;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_538 = local_538 + 8;
      local_540 = local_540 + 8;
    }
    for (local_7c4 = 0; local_7c4 < in_R9D; local_7c4 = local_7c4 + 1) {
      puVar8 = (undefined8 *)((long)local_538 + (long)(local_7c4 << 4) * -4 + -0x80);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
  }
  local_538 = (undefined8 *)((long)local_538 + (long)(*(int *)((long)in_RDI + 0x2c) << 5) * -4);
  for (local_844 = 0; local_844 < in_ECX; local_844 = local_844 + 1) {
    local_850 = local_538;
    for (local_854 = 0; local_854 < in_R8D; local_854 = local_854 + 1) {
      puVar8 = (undefined8 *)((long)local_538 + (long)((in_R8D - local_854) * 0x10) * 4);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
    for (local_8c4 = 0; local_8c4 < *(int *)((long)in_RDI + 0x2c); local_8c4 = local_8c4 + 1) {
      uVar1 = local_850[1];
      uVar2 = local_850[2];
      uVar3 = local_850[3];
      uVar4 = local_850[4];
      uVar5 = local_850[5];
      uVar6 = local_850[6];
      uVar7 = local_850[7];
      *local_540 = *local_850;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_850 = local_850 + 8;
      local_540 = local_540 + 8;
    }
    for (local_944 = 0; local_944 < in_R9D; local_944 = local_944 + 1) {
      puVar8 = (undefined8 *)((long)local_850 + (long)(local_944 << 4) * -4 + -0x80);
      uVar1 = puVar8[1];
      uVar2 = puVar8[2];
      uVar3 = puVar8[3];
      uVar4 = puVar8[4];
      uVar5 = puVar8[5];
      uVar6 = puVar8[6];
      uVar7 = puVar8[7];
      *local_540 = *puVar8;
      local_540[1] = uVar1;
      local_540[2] = uVar2;
      local_540[3] = uVar3;
      local_540[4] = uVar4;
      local_540[5] = uVar5;
      local_540[6] = uVar6;
      local_540[7] = uVar7;
      local_540 = local_540 + 8;
    }
    local_538 = (undefined8 *)((long)local_538 + (long)(*(int *)((long)in_RDI + 0x2c) << 4) * -4);
  }
  return;
}

Assistant:

static void padding_reflect_pack16_avx512(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 16;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0 + (left - x) * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0);
            _mm512_store_ps(outptr, _p);
            ptr0 += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0 - 32 - x * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        ptr -= src.w * 16;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m512 _p = _mm512_load_ps(ptr + (left - x) * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m512 _p = _mm512_load_ps(ptr);
            _mm512_store_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            __m512 _p = _mm512_load_ps(ptr - 32 - x * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 16;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0 + (left - x) * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0);
            _mm512_store_ps(outptr, _p);
            ptr0 += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            __m512 _p = _mm512_load_ps(ptr0 - 32 - x * 16);
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        ptr -= src.w * 16;
    }
}